

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O1

void __thiscall
viennamath::rt_interval<viennamath::rt_expression_interface<double>_>::rt_interval
          (rt_interval<viennamath::rt_expression_interface<double>_> *this)

{
  rt_expression_interface<double> *prVar1;
  
  prVar1 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar1->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00118538;
  prVar1[1]._vptr_rt_expression_interface = (_func_int **)0x0;
  (this->lower_).rt_expr_._M_ptr = prVar1;
  prVar1 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar1->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00118538;
  prVar1[1]._vptr_rt_expression_interface = (_func_int **)0x3ff0000000000000;
  (this->upper_).rt_expr_._M_ptr = prVar1;
  return;
}

Assistant:

explicit rt_interval() : lower_(new rt_constant<numeric_type, InterfaceType>(0)),
                               upper_(new rt_constant<numeric_type, InterfaceType>(1)) {}